

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GoGenerator
          (GoGenerator *this,Parser *parser,string *path,string *file_name,string *go_namespace)

{
  bool bVar1;
  istream *piVar2;
  undefined1 local_528 [8];
  string component;
  istringstream iss;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  Config local_358;
  Config local_208;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *go_namespace_local;
  string *file_name_local;
  string *path_local;
  Parser *parser_local;
  GoGenerator *this_local;
  
  local_30 = go_namespace;
  go_namespace_local = file_name;
  file_name_local = path;
  path_local = (string *)parser;
  parser_local = (Parser *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"go",&local_b1);
  BaseGenerator::BaseGenerator
            (&this->super_BaseGenerator,parser,path,file_name,&local_50,&local_88,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_004fa3c8;
  Namespace::Namespace(&this->go_namespace_);
  this->cur_name_space_ = (Namespace *)0x0;
  anon_unknown_1::GoDefaultConfig();
  WithFlagOptions(&local_208,&local_358,(IDLOptions *)&path_local[0x1f]._M_string_length,
                  file_name_local);
  (anonymous_namespace)::GoKeywords_abi_cxx11_();
  IdlNamer::IdlNamer(&this->namer_,&local_208,&local_388);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_388);
  Namer::Config::~Config(&local_208);
  Namer::Config::~Config(&local_358);
  std::
  set<const_flatbuffers::Definition_*,_flatbuffers::go::GoGenerator::NamespacePtrLess,_std::allocator<const_flatbuffers::Definition_*>_>
  ::set(&this->tracked_imported_namespaces_);
  this->needs_math_import_ = false;
  this->needs_bytes_import_ = false;
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(component.field_2._M_local_buf + 8),(string *)local_30,_S_in);
  std::__cxx11::string::string((string *)local_528);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(component.field_2._M_local_buf + 8),(string *)local_528,'.');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->go_namespace_).components,(value_type *)local_528);
  }
  std::__cxx11::string::~string((string *)local_528);
  std::__cxx11::istringstream::~istringstream((istringstream *)(component.field_2._M_local_buf + 8))
  ;
  return;
}

Assistant:

GoGenerator(const Parser &parser, const std::string &path,
              const std::string &file_name, const std::string &go_namespace)
      : BaseGenerator(parser, path, file_name, "" /* not used*/,
                      "" /* not used */, "go"),
        cur_name_space_(nullptr),
        namer_(WithFlagOptions(GoDefaultConfig(), parser.opts, path),
               GoKeywords()) {
    std::istringstream iss(go_namespace);
    std::string component;
    while (std::getline(iss, component, '.')) {
      go_namespace_.components.push_back(component);
    }
  }